

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_133c8f4::QChildProcess::QChildProcess(QChildProcess *this,QProcessPrivate *d)

{
  CharPointerList *pCVar1;
  QByteArray *pQVar2;
  undefined1 *puVar3;
  char *pcVar4;
  QProcessEnvironmentPrivate *pQVar5;
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar6;
  Data *pDVar7;
  _Rb_tree_node_base *p_Var8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  pointer ppcVar12;
  type ppcVar13;
  _Rb_tree_node_base *p_Var14;
  qsizetype qVar15;
  storage_type *psVar16;
  QString *pQVar17;
  EVP_PKEY_CTX *ctx;
  int in_R8D;
  size_t sVar18;
  long lVar19;
  size_t sVar20;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QUtf8StringView fnName;
  QArrayDataPointer<char> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  sigset_t local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = d;
  bVar9 = QString::contains(&d->program,(QChar)0x2f,CaseSensitive);
  if (bVar9) {
    local_d0.d = (d->program).d.d;
    local_d0.ptr = (d->program).d.ptr;
    local_d0.size = (d->program).d.size;
    if (local_d0.d != (Data *)0x0) {
      LOCK();
      ((local_d0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_b8.__val[0] = 0;
    local_b8.__val[1] = 0;
    local_b8.__val[2] = 0;
    QStandardPaths::findExecutable((QString *)&local_d0,&d->program,(QStringList *)&local_b8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_b8);
  }
  pCVar1 = &this->argv;
  pQVar2 = &(this->argv).data;
  (this->argv).data.d.ptr = (char *)0x0;
  (this->argv).data.d.size = 0;
  (pCVar1->pointers)._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = (char **)0x0;
  (this->argv).data.d.d = (Data *)0x0;
  lVar19 = (d->arguments).d.size;
  ppcVar12 = (pointer)operator_new__(lVar19 * 8 + 0x10);
  sVar18 = lVar19 + 1;
  std::__uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>::reset
            ((__uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_> *)pCVar1,ppcVar12);
  ppcVar13 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                       (&pCVar1->pointers,sVar18);
  *ppcVar13 = (char *)0x0;
  ppcVar13 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                       (&pCVar1->pointers,0);
  *ppcVar13 = (char *)0x0;
  QString::toLocal8Bit((QByteArray *)&local_b8,(QString *)&local_d0);
  pDVar7 = (this->argv).data.d.d;
  pQVar17 = (QString *)(this->argv).data.d.ptr;
  (this->argv).data.d.d = (Data *)local_b8.__val[0];
  (this->argv).data.d.ptr = (char *)local_b8.__val[1];
  puVar3 = (undefined1 *)(this->argv).data.d.size;
  (this->argv).data.d.size = local_b8.__val[2];
  local_b8.__val[0] = (ulong)pDVar7;
  local_b8.__val[1] = (ulong)pQVar17;
  local_b8.__val[2] = (ulong)puVar3;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
  QByteArray::append(pQVar2,'\0');
  pQVar17 = (d->arguments).d.ptr;
  sVar20 = 1;
  for (lVar19 = (d->arguments).d.size * 0x18; lVar19 != 0; lVar19 = lVar19 + -0x18) {
    pcVar4 = (char *)(this->argv).data.d.size;
    ppcVar13 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                         (&pCVar1->pointers,sVar20);
    *ppcVar13 = pcVar4;
    QString::toLocal8Bit((QByteArray *)&local_b8,pQVar17);
    QByteArray::append(pQVar2,(QByteArray *)&local_b8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
    QByteArray::append(pQVar2,'\0');
    pQVar17 = pQVar17 + 1;
    sVar20 = sVar20 + 1;
  }
  CharPointerList::updatePointers(pCVar1,sVar18);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pCVar1 = &this->envp;
  pQVar5 = (d->environment).d.d.ptr;
  (this->envp).data.d.ptr = (char *)0x0;
  (this->envp).data.d.size = 0;
  (this->envp).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = (char **)0x0;
  (this->envp).data.d.d = (Data *)0x0;
  if (pQVar5 != (QProcessEnvironmentPrivate *)0x0) {
    pQVar6 = (pQVar5->vars).d.d.ptr;
    if (pQVar6 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                   *)0x0) {
      sVar20 = 0;
    }
    else {
      sVar20 = *(size_t *)((long)&(pQVar6->m)._M_t._M_impl + 0x28);
    }
    pQVar2 = &(this->envp).data;
    ppcVar12 = (pointer)operator_new__(-(ulong)(sVar20 + 1 >> 0x3d != 0) | sVar20 * 8 + 8);
    std::__uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>::reset
              ((__uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_> *)pCVar1,ppcVar12);
    ppcVar13 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                         (&pCVar1->pointers,sVar20);
    *ppcVar13 = (char *)0x0;
    pQVar6 = (pQVar5->vars).d.d.ptr;
    p_Var8 = (_Rb_tree_node_base *)((long)&(pQVar6->m)._M_t._M_impl + 8);
    if (pQVar6 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                   *)0x0) {
      p_Var14 = (_Rb_tree_node_base *)0x0;
      p_Var8 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var14 = *(_Base_ptr *)((long)&(pQVar6->m)._M_t._M_impl + 0x18);
    }
    sVar18 = 0;
    while (p_Var14 != p_Var8) {
      pcVar4 = (char *)(this->envp).data.d.size;
      ppcVar13 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                           (&pCVar1->pointers,sVar18);
      *ppcVar13 = pcVar4;
      QByteArray::append(pQVar2,(QByteArray *)(p_Var14 + 1));
      QByteArray::append(pQVar2,'=');
      QProcEnvValue::bytes((QByteArray *)&local_b8,(QProcEnvValue *)&p_Var14[1]._M_right);
      QByteArray::append(pQVar2,(QByteArray *)&local_b8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
      QByteArray::append(pQVar2,'\0');
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
      sVar18 = sVar18 + 1;
    }
    CharPointerList::updatePointers(pCVar1,sVar20);
  }
  this->workingDirectory = -2;
  bVar10 = 0;
  this->isUsingVfork = false;
  this->oldstate = 1;
  if ((d->workingDirectory).d.size != 0) {
    QString::toLocal8Bit((QByteArray *)&local_e8,&d->workingDirectory);
    local_b8.__val[0] = 0x4acd50;
    bVar9 = ::operator!=((QByteArray *)&local_e8,(char **)&local_b8);
    if (bVar9) {
      qVar15 = QByteArrayView::lengthHelperCharArray("/.",3);
      bv.m_data = "/.";
      bv.m_size = qVar15;
      bVar9 = QByteArray::endsWith((QByteArray *)&local_e8,bv);
      if (!bVar9) {
        QByteArray::append((QByteArray *)&local_e8,"/.");
      }
    }
    if (local_e8.ptr == (char *)0x0) {
      local_e8.ptr = &QByteArray::_empty;
    }
    iVar11 = qt_safe_open(local_e8.ptr,0x210000,0x1ff);
    this->workingDirectory = iVar11;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
    if (this->workingDirectory < 0) {
      psVar16 = (storage_type *)
                QBasicUtf8StringView<false>::lengthHelperContainer<char,6ul>((char (*) [6])0x53ab41)
      ;
      fnName.m_size = -1;
      fnName.m_data = psVar16;
      errorMessageForSyscall
                ((QString *)&local_b8,(anon_unknown_dwarf_133c8f4 *)0x53ab41,fnName,in_R8D);
      ctx = (EVP_PKEY_CTX *)0x0;
      QProcessPrivate::setErrorAndEmit(d,FailedToStart,(QString *)&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      QProcessPrivate::cleanup(d,ctx);
      this->isUsingVfork = false;
      goto LAB_003d33c0;
    }
    bVar10 = this->isUsingVfork;
  }
  if ((bVar10 & 1) != 0) {
    local_b8.__val[0xe] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[0xf] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[0xc] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[0xd] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[10] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[0xb] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[8] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[9] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[6] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[7] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[4] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[5] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[2] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[3] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[0] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.__val[1] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    sigfillset(&local_b8);
    pthread_sigmask(2,&local_b8,(__sigset_t *)&this->oldsigset);
  }
  pthread_setcancelstate(1,&this->oldstate);
LAB_003d33c0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QChildProcess(QProcessPrivate *d)
        : d(d), argv(resolveExecutable(d->program), d->arguments),
          envp(d->environmentPrivate())
    {
        // Open the working directory first, because this operation can fail.
        // That way, if it does, we don't have anything to clean up.
        if (!d->workingDirectory.isEmpty()) {
            workingDirectory = opendirfd(QFile::encodeName(d->workingDirectory));
            if (workingDirectory < 0) {
                d->setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("chdir"));
                d->cleanup();

                // make sure our destructor does nothing
                isUsingVfork = false;
                return;
            }
        }

        // Block Unix signals, to ensure the user's handlers aren't run in the
        // child side and do something weird, especially if the handler and the
        // user of QProcess are completely different codebases.
        maybeBlockSignals();

        // Disable PThread cancellation until the child has successfully been
        // executed. We make a number of POSIX calls in the child that are thread
        // cancellation points and could cause an unexpected stack unwind. That
        // would be bad enough with regular fork(), but it's likely fatal with
        // vfork().
        disableThreadCancellations();
    }